

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeDumper.cpp
# Opt level: O0

void Js::
     PrintTypedConstants<float,Js::AsmJsByteCodeDumper::DumpConstants(Js::AsmJsFunc*,Js::FunctionBody*)::__2>
               (undefined8 table,Types type,uint nConsts)

{
  uint local_6c;
  char16 local_68 [2];
  uint i;
  char16 buf [32];
  float *constTable;
  uint nConsts_local;
  Types type_local;
  byte *table_local;
  
  if (nConsts != 0) {
    buf._56_8_ = table;
    WAsmJs::RegisterSpace::GetTypeDebugName(type,local_68,0x20,false);
    Output::Print(L"    Constant %s:\n    ======== =======\n    ",local_68);
    WAsmJs::RegisterSpace::GetTypeDebugName(type,local_68,0x20,true);
    for (local_6c = 0; local_6c < nConsts; local_6c = local_6c + 1) {
      Output::Print(L" %s%d  ",local_68,(ulong)local_6c);
      AsmJsByteCodeDumper::DumpConstants::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)((long)&table_local + 7),*(float *)buf._56_8_);
      Output::Print(L"\n    ");
      buf._56_8_ = buf._56_8_ + 4;
    }
  }
  return;
}

Assistant:

void PrintTypedConstants(byte* table, WAsmJs::Types type, uint nConsts, Func printValFunc)
    {
        T* constTable = (T*)table;
        if (nConsts > 0)
        {
            char16 buf[32];
            WAsmJs::RegisterSpace::GetTypeDebugName(type, buf, 32);
            Output::Print(_u("    Constant %s:\n    ======== =======\n    "), buf);
            WAsmJs::RegisterSpace::GetTypeDebugName(type, buf, 32, true);
            for (uint i = 0; i < nConsts; i++)
            {
                Output::Print(_u(" %s%d  "), buf, i);
                printValFunc(*constTable);
                Output::Print(_u("\n    "));
                ++constTable;
            }
        }
    }